

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *flags,cmGeneratorTarget *target,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppBVar2;
  _Rb_tree_header *p_Var3;
  cmMakefile *pcVar4;
  pointer pcVar5;
  bool bVar6;
  ManagedType MVar7;
  cmValue cVar8;
  cmValue cVar9;
  string *psVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  int iVar14;
  pointer pBVar15;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar16;
  string *opt;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  string_view value_00;
  string_view arg;
  string jmcFlags;
  string compReqFlag;
  cmValue wErrorOpts;
  string *local_208;
  cmStandardLevelResolver standardResolver;
  string local_1e8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts;
  ios_base local_158 [264];
  string langFlagRegexVar;
  
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)lang->_M_string_length;
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x773473;
  views._M_len = 3;
  views._M_array = (iterator)&targetCompileOpts;
  cmCatViews_abi_cxx11_(&langFlagRegexVar,views);
  cVar8 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  ppBVar2 = &targetCompileOpts.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
  if (cVar8.Value == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetCompileOpts,"COMPILE_FLAGS","")
    ;
    cVar8 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
    if (targetCompileOpts.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
      operator_delete(targetCompileOpts.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((targetCompileOpts.
                                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value).
                                     _M_dataplus._M_p + 1));
    }
    if (cVar8.Value != (string *)0x0) {
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)targetCompileOpts.
                            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
      (*this->_vptr_cmLocalGenerator[6])(this,&targetCompileOpts,cVar8.Value);
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts);
      }
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
        operator_delete(targetCompileOpts.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((targetCompileOpts.
                                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_dataplus._M_p + 1));
      }
    }
    cmGeneratorTarget::GetCompileOptions(&targetCompileOpts,target,config,lang);
    AppendCompileOptions(this,flags,&targetCompileOpts,(char *)0x0);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetCompileOpts,"COMPILE_FLAGS","")
    ;
    cVar9 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
    if (targetCompileOpts.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
      operator_delete(targetCompileOpts.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((targetCompileOpts.
                                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value).
                                     _M_dataplus._M_p + 1));
    }
    if (cVar9.Value != (string *)0x0) {
      compReqFlag._M_dataplus._M_p = (pointer)0x0;
      compReqFlag._M_string_length = 0;
      compReqFlag.field_2._M_allocated_capacity = 0;
      cmSystemTools::ParseWindowsCommandLine
                (((cVar9.Value)->_M_dataplus)._M_p,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&compReqFlag);
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)targetCompileOpts.
                            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
      AppendCompileOptions
                (this,(string *)&targetCompileOpts,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&compReqFlag,((cVar8.Value)->_M_dataplus)._M_p);
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts);
      }
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
        operator_delete(targetCompileOpts.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((targetCompileOpts.
                                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_dataplus._M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&compReqFlag);
    }
    cmGeneratorTarget::GetCompileOptions(&targetCompileOpts,target,config,lang);
    AppendCompileOptions(this,flags,&targetCompileOpts,((cVar8.Value)->_M_dataplus)._M_p);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&targetCompileOpts);
  standardResolver.Makefile = this->Makefile;
  p_Var12 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var3) {
    do {
      cVar8 = cmGeneratorTarget::GetLanguageStandard(target,(string *)(p_Var12 + 1),config);
      if (cVar8.Value == (string *)0x0) {
        iVar14 = 3;
      }
      else {
        bVar6 = cmStandardLevelResolver::IsLaterStandard
                          (&standardResolver,(string *)(p_Var12 + 1),cVar8.Value,
                           (string *)(p_Var12 + 2));
        iVar14 = 0;
        if (bVar6) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&targetCompileOpts);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&targetCompileOpts,"The COMPILE_FEATURES property of target \"",0x29
                    );
          psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&targetCompileOpts,(psVar10->_M_dataplus)._M_p,
                               psVar10->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" was evaluated when computing the link implementation, and the \"",
                     0x41);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_STANDARD\" was \"",0x10);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)(p_Var12 + 2),(long)p_Var12[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                     ,0x6f);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_STANDARD\" \"",0xc);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,((cVar8.Value)->_M_dataplus)._M_p,
                               (cVar8.Value)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation.\n"
                     ,0x76);
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&compReqFlag,
                              &this->DirectoryBacktrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)compReqFlag._M_dataplus._M_p != &compReqFlag.field_2) {
            operator_delete(compReqFlag._M_dataplus._M_p,
                            compReqFlag.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targetCompileOpts);
          std::ios_base::~ios_base(local_158);
          iVar14 = 1;
        }
      }
      if ((iVar14 != 3) && (iVar14 != 0)) goto LAB_0027f76a;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var3);
  }
  compReqFlag._M_string_length = 0;
  compReqFlag.field_2._M_allocated_capacity =
       compReqFlag.field_2._M_allocated_capacity & 0xffffffffffffff00;
  compReqFlag._M_dataplus._M_p = (pointer)&compReqFlag.field_2;
  AddCompilerRequirementFlag(this,&compReqFlag,target,lang,config);
  if (compReqFlag._M_string_length != 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)flags,
               &compReqFlag);
  }
  ppBVar2 = &targetCompileOpts.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (this->GlobalGenerator->CMakeInstance->IgnoreWarningAsError == false) {
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&targetCompileOpts,"COMPILE_WARNING_AS_ERROR","");
    cVar8 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
    if (targetCompileOpts.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
      operator_delete(targetCompileOpts.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((targetCompileOpts.
                                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value).
                                     _M_dataplus._M_p + 1));
    }
    pcVar4 = this->Makefile;
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)lang->_M_string_length;
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x773473;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&targetCompileOpts;
    cmCatViews_abi_cxx11_(&jmcFlags,views_00);
    wErrorOpts = cmMakefile::GetDefinition(pcVar4,&jmcFlags);
    pcVar16 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jmcFlags._M_dataplus._M_p != &jmcFlags.field_2) {
      operator_delete(jmcFlags._M_dataplus._M_p,
                      CONCAT71(jmcFlags.field_2._M_allocated_capacity._1_7_,
                               jmcFlags.field_2._M_local_buf[0]) + 1);
      pcVar16 = extraout_RDX_00;
    }
    if (cVar8.Value != (string *)0x0) {
      value._M_str = pcVar16;
      value._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
      bVar6 = cmValue::IsOn((cmValue *)(cVar8.Value)->_M_string_length,value);
      if (bVar6) {
        bVar6 = cmValue::IsSet(&wErrorOpts);
        if (bVar6) {
          targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)targetCompileOpts.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          cVar8 = wErrorOpts;
          if (wErrorOpts.Value == (string *)0x0) {
            cVar8.Value = &cmValue::Empty_abi_cxx11_;
          }
          targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
          AppendCompileOptions(this,(string *)&targetCompileOpts,cVar8.Value,(char *)0x0);
          if (targetCompileOpts.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &targetCompileOpts);
          }
          if (targetCompileOpts.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
            operator_delete(targetCompileOpts.
                            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((targetCompileOpts.
                                             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           Value)._M_dataplus._M_p + 1));
          }
        }
      }
    }
  }
  pcVar4 = this->Makefile;
  std::operator+(&jmcFlags,"CMAKE_",lang);
  plVar13 = (long *)std::__cxx11::string::append((char *)&jmcFlags);
  pBVar15 = (pointer)(plVar13 + 2);
  if ((pointer)*plVar13 == pBVar15) {
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pBVar15->Value)._M_dataplus._M_p;
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
  }
  else {
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pBVar15->Value)._M_dataplus._M_p;
    targetCompileOpts.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
  }
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
  *plVar13 = (long)pBVar15;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  cVar8 = cmMakefile::GetDefinition(pcVar4,(string *)&targetCompileOpts);
  if (targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
    operator_delete(targetCompileOpts.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((targetCompileOpts.
                                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value).
                                   _M_dataplus._M_p + 1));
  }
  paVar1 = &jmcFlags.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)jmcFlags._M_dataplus._M_p != paVar1) {
    operator_delete(jmcFlags._M_dataplus._M_p,
                    CONCAT71(jmcFlags.field_2._M_allocated_capacity._1_7_,
                             jmcFlags.field_2._M_local_buf[0]) + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    MVar7 = cmGeneratorTarget::GetManagedType(target,config);
    if (MVar7 != Managed) {
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppBVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetCompileOpts,"VS_JUST_MY_CODE_DEBUGGING","");
      cVar9 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppBVar2) {
        operator_delete(targetCompileOpts.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((targetCompileOpts.
                                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_dataplus._M_p + 1));
      }
      if (cVar9.Value != (string *)0x0) {
        pcVar5 = ((cVar9.Value)->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar5,pcVar5 + (cVar9.Value)->_M_string_length);
        jmcFlags._M_string_length = 0;
        jmcFlags.field_2._M_local_buf[0] = '\0';
        jmcFlags._M_dataplus._M_p = (pointer)paVar1;
        cmGeneratorExpression::Evaluate
                  ((string *)&targetCompileOpts,&local_1e8,this,config,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&jmcFlags);
        pcVar16 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)jmcFlags._M_dataplus._M_p != paVar1) {
          operator_delete(jmcFlags._M_dataplus._M_p,
                          CONCAT71(jmcFlags.field_2._M_allocated_capacity._1_7_,
                                   jmcFlags.field_2._M_local_buf[0]) + 1);
          pcVar16 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          pcVar16 = extraout_RDX_03;
        }
        value_00._M_str = pcVar16;
        value_00._M_len =
             (size_t)targetCompileOpts.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = cmValue::IsOn((cmValue *)
                              targetCompileOpts.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,value_00);
        if (bVar6) {
          arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar8.Value)->_M_string_length;
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&wErrorOpts,arg,false);
          jmcFlags._M_string_length = 0;
          jmcFlags.field_2._M_local_buf[0] = '\0';
          jmcFlags._M_dataplus._M_p = (pointer)paVar1;
          if (wErrorOpts.Value != local_208) {
            cVar8 = wErrorOpts;
            do {
              (*this->_vptr_cmLocalGenerator[8])(this,&jmcFlags,cVar8.Value);
              cVar8.Value = cVar8.Value + 1;
            } while (cVar8.Value != local_208);
          }
          if (jmcFlags._M_string_length != 0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       flags,&jmcFlags);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)jmcFlags._M_dataplus._M_p != paVar1) {
            operator_delete(jmcFlags._M_dataplus._M_p,
                            CONCAT71(jmcFlags.field_2._M_allocated_capacity._1_7_,
                                     jmcFlags.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&wErrorOpts);
        }
        if (targetCompileOpts.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&targetCompileOpts.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(targetCompileOpts.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((targetCompileOpts.
                                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         Value)._M_dataplus._M_p + 1));
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compReqFlag._M_dataplus._M_p != &compReqFlag.field_2) {
    operator_delete(compReqFlag._M_dataplus._M_p,compReqFlag.field_2._M_allocated_capacity + 1);
  }
LAB_0027f76a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)langFlagRegexVar._M_dataplus._M_p != &langFlagRegexVar.field_2) {
    operator_delete(langFlagRegexVar._M_dataplus._M_p,
                    langFlagRegexVar.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::vector<BT<std::string>>& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = cmStrCat("CMAKE_", lang, "_FLAG_REGEX");

  if (cmValue langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      std::vector<std::string> opts;
      cmSystemTools::ParseWindowsCommandLine(targetFlags->c_str(), opts);
      // Re-escape these flags since COMPILE_FLAGS were already parsed
      // as a command line above.
      std::string compileOpts;
      this->AppendCompileOptions(compileOpts, opts, langFlagRegexStr->c_str());
      if (!compileOpts.empty()) {
        flags.emplace_back(std::move(compileOpts));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts,
                               langFlagRegexStr->c_str());
  } else {
    // Use all flags.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      std::string compileFlags;
      this->AppendFlags(compileFlags, *targetFlags);
      if (!compileFlags.empty()) {
        flags.emplace_back(std::move(compileFlags));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts);
  }

  cmStandardLevelResolver standardResolver(this->Makefile);
  for (auto const& it : target->GetMaxLanguageStandards()) {
    cmValue standard = target->GetLanguageStandard(it.first, config);
    if (!standard) {
      continue;
    }
    if (standardResolver.IsLaterStandard(it.first, *standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << *standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation.\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string compReqFlag;
  this->AddCompilerRequirementFlag(compReqFlag, target, lang, config);
  if (!compReqFlag.empty()) {
    flags.emplace_back(std::move(compReqFlag));
  }

  // Add Warning as errors flags
  if (!this->GetCMakeInstance()->GetIgnoreWarningAsError()) {
    const cmValue wError = target->GetProperty("COMPILE_WARNING_AS_ERROR");
    const cmValue wErrorOpts = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_WARNING_AS_ERROR"));
    if (wError.IsOn() && wErrorOpts.IsSet()) {
      std::string wErrorFlags;
      this->AppendCompileOptions(wErrorFlags, *wErrorOpts);
      if (!wErrorFlags.empty()) {
        flags.emplace_back(std::move(wErrorFlags));
      }
    }
  }

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (cmValue jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (cmValue jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        std::string isJMCEnabled =
          cmGeneratorExpression::Evaluate(*jmcExprGen, this, config);
        if (cmIsOn(isJMCEnabled)) {
          std::vector<std::string> optVec = cmExpandedList(*jmc);
          std::string jmcFlags;
          this->AppendCompileOptions(jmcFlags, optVec);
          if (!jmcFlags.empty()) {
            flags.emplace_back(std::move(jmcFlags));
          }
        }
      }
    }
  }
}